

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  uint channelsOut;
  ma_uint32 channelsIn;
  ma_attenuation_model mVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  byte channelPosition;
  ma_bool32 mVar4;
  float *pfVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  undefined8 uVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float in_XMM1_Db;
  float fVar12;
  float fVar13;
  float fVar14;
  ma_vec3f mVar15;
  ma_vec3f mVar16;
  ma_channel_mix_mode in_stack_fffffffffffffee0;
  ma_mono_expansion_mode in_stack_fffffffffffffee8;
  float local_108;
  float fStack_104;
  ma_vec3f local_f8;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d0;
  ma_uint32 local_cc;
  ma_vec3f local_c8;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  float *local_98;
  ma_spatializer_listener *local_90;
  ma_channel *local_88;
  ma_uint64 local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  undefined1 local_48 [16];
  
  local_88 = pSpatializer->pChannelMapIn;
  local_e8 = (pListener->config).pChannelMapOut;
  if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
    if (pListener->isEnabled == 0) {
      ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,pSpatializer->channelsOut);
    }
    else {
      channelsIn = pSpatializer->channelsIn;
      if (channelsIn == pSpatializer->channelsOut) {
        if (pFramesOut != pFramesIn) {
          memcpy(pFramesOut,pFramesIn,(channelsIn << 2) * frameCount);
        }
      }
      else {
        ma_channel_map_apply_f32
                  ((float *)pFramesOut,local_e8,pSpatializer->channelsOut,(float *)pFramesIn,
                   local_88,channelsIn,frameCount,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffee8);
      }
    }
    pSpatializer->dopplerPitch = 1.0;
    return MA_SUCCESS;
  }
  local_cc = pSpatializer->channelsIn;
  channelsOut = pSpatializer->channelsOut;
  fVar14 = pSpatializer->minDistance;
  local_a8._0_4_ = pSpatializer->maxDistance;
  _local_b8 = ZEXT416((uint)pSpatializer->rolloff);
  local_78 = ZEXT416((uint)pSpatializer->dopplerFactor);
  mVar15 = ma_atomic_vec3f_get(&pListener->velocity);
  local_58 = mVar15.z;
  local_68 = mVar15._0_8_;
  local_48 = ZEXT416((uint)(pListener->config).speedOfSound);
  local_98 = (float *)pFramesOut;
  uStack_60 = extraout_XMM0_Qb;
  fStack_54 = in_XMM1_Db;
  if (pSpatializer->positioning == ma_positioning_relative) {
    mVar15 = ma_atomic_vec3f_get(&pSpatializer->position);
    local_d0 = mVar15.z;
    local_f8 = mVar15;
    local_c8 = ma_atomic_vec3f_get(&pSpatializer->direction);
    local_108 = mVar15.x;
    fStack_104 = mVar15.y;
    fVar13 = local_d0;
  }
  else {
    ma_spatializer_get_relative_position_and_direction(pSpatializer,pListener,&local_f8,&local_c8);
    local_108 = local_f8.x;
    fStack_104 = local_f8.y;
    pFramesOut = local_98;
    fVar13 = local_f8.z;
  }
  fVar12 = SQRT(fVar13 * fVar13 + local_108 * local_108 + fStack_104 * fStack_104);
  mVar1 = pSpatializer->attenuationModel;
  fVar13 = 1.0;
  if (mVar1 == ma_attenuation_model_exponential) {
    if (fVar14 < (float)local_a8._0_4_) {
      fVar13 = fVar12;
      if ((float)local_a8._0_4_ <= fVar12) {
        fVar13 = (float)local_a8._0_4_;
      }
      fVar7 = fVar14;
      if (fVar14 <= fVar13) {
        fVar7 = fVar13;
      }
      dVar8 = pow((double)(fVar7 / fVar14),(double)-(float)local_b8._0_4_);
      fVar13 = (float)dVar8;
    }
  }
  else if (mVar1 == ma_attenuation_model_linear) {
    if (fVar14 < (float)local_a8._0_4_) {
      fVar13 = fVar12;
      if ((float)local_a8._0_4_ <= fVar12) {
        fVar13 = (float)local_a8._0_4_;
      }
      fVar7 = fVar14;
      if (fVar14 <= fVar13) {
        fVar7 = fVar13;
      }
      fVar13 = 1.0 - ((fVar7 - fVar14) * (float)local_b8._0_4_) / ((float)local_a8._0_4_ - fVar14);
    }
  }
  else if ((mVar1 == ma_attenuation_model_inverse) && (fVar14 < (float)local_a8._0_4_)) {
    fVar13 = fVar12;
    if ((float)local_a8._0_4_ <= fVar12) {
      fVar13 = (float)local_a8._0_4_;
    }
    fVar7 = fVar14;
    if (fVar14 <= fVar13) {
      fVar7 = fVar13;
    }
    fVar13 = fVar14 / ((float)local_b8._0_4_ * (fVar7 - fVar14) + fVar14);
  }
  if (fVar12 <= 0.001) {
    fVar14 = 0.0;
  }
  else {
    fVar14 = 1.0 / fVar12;
    local_b8._0_4_ = fVar14 * local_f8.x;
    local_b8._4_4_ = fVar14 * local_f8.y;
    fStack_b0 = fVar14 * 0.0;
    fStack_ac = fVar14 * 0.0;
    local_a8 = ZEXT416((uint)(fVar14 * local_f8.z));
    mVar15.z = -(fVar14 * local_f8.z);
    uVar6 = CONCAT44(local_b8._4_4_,local_b8._0_4_) ^ 0x8000000080000000;
    mVar15.x = (float)(int)uVar6;
    mVar15.y = (float)(int)(uVar6 >> 0x20);
    fVar14 = ma_calculate_angular_gain
                       (local_c8,mVar15,pSpatializer->coneInnerAngleInRadians,
                        pSpatializer->coneOuterAngleInRadians,pSpatializer->coneOuterGain);
    auVar11 = _local_b8;
    fVar13 = fVar13 * fVar14;
    fVar7 = (pListener->config).coneInnerAngleInRadians;
    fVar14 = fVar12;
    if (fVar7 < 6.283185) {
      auVar3._4_8_ = 0;
      auVar3._0_4_ = *(uint *)(&DAT_00175528 +
                              (ulong)((pListener->config).handedness == ma_handedness_right) * 4);
      mVar16.z = (float)local_a8._0_4_;
      mVar16.x = (float)local_b8._0_4_;
      mVar16.y = (float)local_b8._4_4_;
      _local_b8 = auVar11;
      fVar7 = ma_calculate_angular_gain
                        ((ma_vec3f)(auVar3 << 0x40),mVar16,fVar7,
                         (pListener->config).coneOuterAngleInRadians,
                         (pListener->config).coneOuterGain);
      fVar13 = fVar13 * fVar7;
    }
  }
  pfVar5 = &pSpatializer->maxGain;
  fVar7 = fVar13;
  if (pSpatializer->maxGain <= fVar13) {
    fVar7 = *pfVar5;
  }
  if (pSpatializer->minGain <= fVar7) {
    if (fVar13 < *pfVar5) goto LAB_00141929;
  }
  else {
    pfVar5 = &pSpatializer->minGain;
  }
  fVar13 = *pfVar5;
LAB_00141929:
  for (uVar6 = 0; channelsOut != uVar6; uVar6 = uVar6 + 1) {
    pSpatializer->pNewChannelGainsOut[uVar6] = fVar13;
  }
  local_90 = pListener;
  local_80 = frameCount;
  if (pListener->isEnabled == 0) {
    ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,pSpatializer->channelsOut);
  }
  else {
    ma_channel_map_apply_f32
              ((float *)pFramesOut,local_e8,channelsOut,(float *)pFramesIn,local_88,local_cc,
               frameCount,in_stack_fffffffffffffee0,(ma_mono_expansion_mode)fVar14);
  }
  if (0.001 < fVar12) {
    fVar14 = 1.0 / fVar14;
    local_a8._0_4_ = fVar14 * local_f8.x;
    fVar13 = local_f8.y;
    fVar12 = fVar14 * local_f8.z;
    for (uVar6 = 0; channelsOut != uVar6; uVar6 = uVar6 + 1) {
      channelPosition = ma_channel_map_get_channel(local_e8,channelsOut,(ma_uint32)uVar6);
      mVar4 = ma_is_spatial_channel_position(channelPosition);
      fVar7 = 1.0;
      if (mVar4 != 0) {
        uVar9 = 0;
        fVar7 = -1.0;
        if (channelPosition < 0x34) {
          uVar9._0_4_ = g_maChannelDirections[channelPosition].x;
          uVar9._4_4_ = g_maChannelDirections[channelPosition].y;
          fVar7 = g_maChannelDirections[channelPosition].z;
        }
        fVar7 = (((float)((ulong)uVar9 >> 0x20) * fVar13 * fVar14 +
                  (float)local_a8._0_4_ * (float)uVar9 + fVar7 * fVar12 + -1.0) *
                 pSpatializer->directionalAttenuationFactor + 1.0 + 1.0) * 0.5;
      }
      if (fVar7 <= pSpatializer->minSpatializationChannelGain) {
        fVar7 = pSpatializer->minSpatializationChannelGain;
      }
      pSpatializer->pNewChannelGainsOut[uVar6] = fVar7 * pSpatializer->pNewChannelGainsOut[uVar6];
    }
  }
  ma_gainer_set_gains(&pSpatializer->gainer,pSpatializer->pNewChannelGainsOut);
  ma_gainer_process_pcm_frames(&pSpatializer->gainer,local_98,local_98,local_80);
  fVar13 = 1.0;
  fVar14 = 0.0;
  uStack_e0 = 0;
  uStack_dc = 0;
  if (0.0 < (float)local_78._0_4_) {
    mVar15 = ma_spatializer_listener_get_position(local_90);
    local_e8._0_4_ = mVar15.z;
    local_e8._4_4_ = fVar14;
    mVar16 = ma_atomic_vec3f_get(&pSpatializer->position);
    local_108 = mVar15.x;
    fStack_104 = mVar15.y;
    local_108 = local_108 - mVar16.x;
    fStack_104 = fStack_104 - mVar16.y;
    local_e8 = (ma_channel *)CONCAT44(local_e8._4_4_,(float)local_e8 - mVar16.z);
    fVar12 = fStack_104;
    mVar15 = ma_atomic_vec3f_get(&pSpatializer->velocity);
    fVar13 = 1.0;
    fVar7 = SQRT((float)local_e8 * (float)local_e8 + local_108 * local_108 + fVar12 * fVar12);
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      fVar13 = (float)local_48._0_4_ / (float)local_78._0_4_;
      auVar10._0_4_ =
           local_58 * (float)local_e8 + (float)local_68 * local_108 + local_68._4_4_ * fVar12;
      auVar10._4_4_ = mVar15.z * (float)local_e8 + mVar15.x * local_108 + mVar15.y * fStack_104;
      auVar10._8_4_ =
           fStack_54 * (float)local_e8 + local_68._4_4_ * local_108 + (float)uStack_60 * fStack_104;
      auVar10._12_4_ =
           fVar14 * (float)local_e8 + mVar15.y * local_108 + uStack_60._4_4_ * fStack_104;
      auVar11._4_4_ = fVar7;
      auVar11._0_4_ = fVar7;
      auVar11._8_4_ = fVar7;
      auVar11._12_4_ = fVar7;
      auVar11 = divps(auVar10,auVar11);
      auVar2._4_4_ = fVar13;
      auVar2._0_4_ = fVar13;
      auVar2._8_4_ = fVar13;
      auVar2._12_4_ = fVar13;
      auVar11 = minps(auVar11,auVar2);
      fVar13 = ((float)local_48._0_4_ - (float)local_78._0_4_ * auVar11._0_4_) /
               ((float)local_48._0_4_ - (float)local_78._0_4_ * auVar11._4_4_);
    }
  }
  pSpatializer->dopplerPitch = fVar13;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (ma_atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The velocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = ma_spatializer_listener_get_velocity(pListener);
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = ma_spatializer_get_position(pSpatializer);
            relativeDir = ma_spatializer_get_direction(pSpatializer);
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source angular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        The gain needs to be applied per-channel here. The spatialization code below will be changing the per-channel
        gains which will then eventually be passed into the gainer which will deal with smoothing the gain transitions
        to avoid harsh changes in gain.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }


        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = pSpatializer->minSpatializationChannelGain;

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(ma_spatializer_listener_get_position(pListener), ma_spatializer_get_position(pSpatializer)), ma_spatializer_get_velocity(pSpatializer), listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}